

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjgc.cpp
# Opt level: O2

void GC::DelSoftRoot(DObject *obj)

{
  DObject *pDVar1;
  DObject **ppDVar2;
  DObject **ppDVar3;
  
  if ((obj->ObjectFlags & 0x10) != 0) {
    obj->ObjectFlags = obj->ObjectFlags & 0xffffffef;
    ppDVar2 = (DObject **)&SoftRoots;
    do {
      ppDVar3 = ppDVar2;
      pDVar1 = *ppDVar3;
      if (pDVar1 == (DObject *)0x0) break;
      ppDVar2 = &pDVar1->ObjNext;
    } while (pDVar1 != obj);
    if (pDVar1 == obj) {
      *ppDVar3 = obj->ObjNext;
      obj->ObjNext = Root;
      Root = obj;
      return;
    }
  }
  return;
}

Assistant:

void DelSoftRoot(DObject *obj)
{
	DObject **probe;

	if (!(obj->ObjectFlags & OF_Rooted))
	{ // Not rooted, so nothing to do.
		return;
	}
	obj->ObjectFlags &= ~OF_Rooted;
	// Move object out of the soft roots part of the list.
	probe = &SoftRoots;
	while (*probe != NULL && *probe != obj)
	{
		probe = &(*probe)->ObjNext;
	}
	if (*probe == obj)
	{
		*probe = obj->ObjNext;
		obj->ObjNext = Root;
		Root = obj;
	}
}